

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O0

PsbtScriptDataStruct * __thiscall
cfd::api::json::PsbtScriptData::ConvertToStruct(PsbtScriptData *this)

{
  long in_RSI;
  PsbtScriptDataStruct *in_RDI;
  PsbtScriptDataStruct *unaff_retaddr;
  PsbtScriptDataStruct *result;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffb8;
  PsbtScriptDataStruct *this_00;
  
  this_00 = in_RDI;
  PsbtScriptDataStruct::PsbtScriptDataStruct(unaff_retaddr);
  std::__cxx11::string::operator=((string *)in_RDI,(string *)(in_RSI + 0x38));
  std::__cxx11::string::operator=((string *)&in_RDI->hex,(string *)(in_RSI + 0x58));
  std::__cxx11::string::operator=((string *)&in_RDI->type,(string *)(in_RSI + 0x78));
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_00,in_stack_ffffffffffffffb8);
  return this_00;
}

Assistant:

PsbtScriptDataStruct PsbtScriptData::ConvertToStruct() const {  // NOLINT
  PsbtScriptDataStruct result;
  result.asm_ = asm__;
  result.hex = hex_;
  result.type = type_;
  result.ignore_items = ignore_items;
  return result;
}